

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformmenu.h
# Opt level: O0

void __thiscall QPlatformMenuBar::QPlatformMenuBar(QPlatformMenuBar *this)

{
  QObject *in_RDI;
  
  QObject::QObject(in_RDI,(QObject *)0x0);
  *(undefined ***)in_RDI = &PTR_metaObject_00e18f78;
  return;
}

Assistant:

class Q_GUI_EXPORT QPlatformMenuBar : public QObject
{
Q_OBJECT
public:
    virtual void insertMenu(QPlatformMenu *menu, QPlatformMenu *before) = 0;
    virtual void removeMenu(QPlatformMenu *menu) = 0;
    virtual void syncMenu(QPlatformMenu *menuItem) = 0;
    virtual void handleReparent(QWindow *newParentWindow) = 0;
    virtual QWindow *parentWindow() const { return nullptr; }

    virtual QPlatformMenu *menuForTag(quintptr tag) const = 0;
    virtual QPlatformMenu *createMenu() const;
}